

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

void sect_EndUnion(void)

{
  UnionStackEntry *pUVar1;
  
  if (unionStack != (UnionStackEntry *)0x0) {
    endUnionMember();
    curOffset = curOffset + unionStack->size;
    pUVar1 = unionStack->next;
    free(unionStack);
    unionStack = pUVar1;
    return;
  }
  error("Found ENDU outside of a UNION construct\n");
  return;
}

Assistant:

void sect_EndUnion(void)
{
	if (!unionStack) {
		error("Found ENDU outside of a UNION construct\n");
		return;
	}
	endUnionMember();
	curOffset += unionStack->size;
	struct UnionStackEntry *next = unionStack->next;

	free(unionStack);
	unionStack = next;
}